

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_compute_parameters(MACROBLOCKD *xd,TX_SIZE tx_size)

{
  cfl_subtract_average_fn p_Var1;
  byte in_SIL;
  long in_RDI;
  CFL_CTX *cfl;
  
  cfl_pad((CFL_CTX *)(in_RDI + 0x2a18),tx_size_wide[in_SIL],tx_size_high[in_SIL]);
  p_Var1 = (*cfl_get_subtract_average_fn)(in_SIL);
  (*p_Var1)((uint16_t *)(in_RDI + 0x2a18),(int16_t *)(in_RDI + 0x3218));
  *(undefined4 *)(in_RDI + 0x3aa4) = 1;
  return;
}

Assistant:

static void cfl_compute_parameters(MACROBLOCKD *const xd, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  // Do not call cfl_compute_parameters multiple time on the same values.
  assert(cfl->are_parameters_computed == 0);

  cfl_pad(cfl, tx_size_wide[tx_size], tx_size_high[tx_size]);
  cfl_get_subtract_average_fn(tx_size)(cfl->recon_buf_q3, cfl->ac_buf_q3);
  cfl->are_parameters_computed = 1;
}